

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O0

void __thiscall QLabelPrivate::ensureTextControl(QLabelPrivate *this)

{
  bool bVar1;
  QWidget *pQVar2;
  QWidgetTextControl *slot;
  QTextDocument *pQVar3;
  ContextType *context;
  QLabelPrivate *in_RDI;
  long in_FS_OFFSET;
  QLabel *q;
  QPalette *in_stack_fffffffffffffef8;
  QWidget *in_stack_ffffffffffffff00;
  QWidgetTextControl *in_stack_ffffffffffffff08;
  QWidgetTextControl *pQVar4;
  undefined8 in_stack_ffffffffffffff18;
  QFlagsStorage<Qt::TextInteractionFlag> flags;
  QObject *in_stack_ffffffffffffff28;
  QWidgetTextControl *in_stack_ffffffffffffff30;
  Connection *this_00;
  offset_in_QWidgetTextControl_to_subr in_stack_ffffffffffffff70;
  Function slot_00;
  offset_in_QWidgetTextControl_to_subr signal;
  Connection local_48;
  code *local_40;
  undefined8 local_38;
  Connection local_30;
  offset_in_QWidget_to_subr local_28;
  Connection local_18;
  Int local_c;
  long local_8;
  
  flags.i = (Int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QWidget *)q_func(in_RDI);
  if (((*(ushort *)&in_RDI->field_0x340 >> 4 & 1) != 0) &&
     (in_RDI->control == (QWidgetTextControl *)0x0)) {
    slot = (QWidgetTextControl *)operator_new(0x18);
    QWidgetTextControl::QWidgetTextControl(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    in_RDI->control = slot;
    pQVar3 = QWidgetTextControl::document((QWidgetTextControl *)in_stack_ffffffffffffff00);
    QTextDocument::setUndoRedoEnabled(SUB81(pQVar3,0));
    context = (ContextType *)
              QWidgetTextControl::document((QWidgetTextControl *)in_stack_ffffffffffffff00);
    QWidget::font(pQVar2);
    QTextDocument::setDefaultFont((QFont *)context);
    bVar1 = std::operator!=((function<QVariant_(const_QUrl_&)> *)in_stack_ffffffffffffff00,
                            in_stack_fffffffffffffef8);
    if (bVar1) {
      pQVar3 = QWidgetTextControl::document((QWidgetTextControl *)in_stack_ffffffffffffff00);
      QTextDocument::setResourceProvider((function *)pQVar3);
    }
    local_c = (in_RDI->textInteractionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
              super_QFlagsStorage<Qt::TextInteractionFlag>.i;
    QWidgetTextControl::setTextInteractionFlags
              (in_stack_ffffffffffffff08,(TextInteractionFlags)flags.i);
    QWidgetTextControl::setOpenExternalLinks
              ((QWidgetTextControl *)in_stack_ffffffffffffff00,
               SUB81((ulong)in_stack_fffffffffffffef8 >> 0x38,0));
    pQVar4 = in_RDI->control;
    QWidget::palette(in_stack_ffffffffffffff00);
    QWidgetTextControl::setPalette
              ((QWidgetTextControl *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    pQVar2 = (QWidget *)in_RDI->control;
    QWidget::hasFocus(pQVar2);
    QWidgetTextControl::setFocus
              ((QWidgetTextControl *)pQVar2,SUB81((ulong)pQVar4 >> 0x38,0),(FocusReason)pQVar4);
    signal = 0;
    local_28 = QNonConstOverload<>::operator()
                         ((QNonConstOverload<> *)&qOverload<>,
                          (offset_in_QWidget_to_subr)QWidget::update);
    slot_00 = 0;
    this_00 = &local_18;
    QObject::connect<void(QWidgetTextControl::*)(QRectF_const&),void(QWidget::*)()>
              ((Object *)in_RDI,in_stack_ffffffffffffff70,context,(offset_in_QWidget_to_subr *)slot,
               (ConnectionType)signal);
    QMetaObject::Connection::~Connection(this_00);
    local_40 = QLabel::linkActivated;
    local_38 = 0;
    QObject::connect<void(QWidgetTextControl::*)(QString_const&),void(QLabel::*)(QString_const&)>
              ((Object *)in_RDI,0,(ContextType *)context,(offset_in_QLabel_to_subr *)slot,
               (ConnectionType)signal);
    QMetaObject::Connection::~Connection(&local_30);
    QObjectPrivate::
    connect<void(QWidgetTextControl::*)(QString_const&),void(QLabelPrivate::*)(QString_const&)>
              ((Object *)0x0,signal,(Object *)QWidgetTextControl::linkHovered,slot_00,
               (ConnectionType)((ulong)in_RDI >> 0x20));
    QMetaObject::Connection::~Connection(&local_48);
    *(ushort *)&in_RDI->field_0x340 = *(ushort *)&in_RDI->field_0x340 & 0xfffb | 4;
    *(ushort *)&in_RDI->field_0x340 = *(ushort *)&in_RDI->field_0x340 & 0xfff7 | 8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLabelPrivate::ensureTextControl() const
{
    Q_Q(const QLabel);
    if (!isTextLabel)
        return;
    if (!control) {
        control = new QWidgetTextControl(const_cast<QLabel *>(q));
        control->document()->setUndoRedoEnabled(false);
        control->document()->setDefaultFont(q->font());
        if (resourceProvider != nullptr)
            control->document()->setResourceProvider(resourceProvider);
        control->setTextInteractionFlags(textInteractionFlags);
        control->setOpenExternalLinks(openExternalLinks);
        control->setPalette(q->palette());
        control->setFocus(q->hasFocus());
        QObject::connect(control, &QWidgetTextControl::updateRequest,
                         q, qOverload<>(&QLabel::update));
        QObject::connect(control, &QWidgetTextControl::linkActivated,
                         q, &QLabel::linkActivated);
        QObjectPrivate::connect(control, &QWidgetTextControl::linkHovered,
                                this, &QLabelPrivate::linkHovered);
        textLayoutDirty = true;
        textDirty = true;
    }
}